

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.cpp
# Opt level: O0

void __thiscall
setup::info::load_entries<setup::run_entry>
          (info *this,istream *is,entry_types entries,size_t count,
          vector<setup::run_entry,_std::allocator<setup::run_entry>_> *result,enum_type entry_type)

{
  TypesafeBoolean p_Var1;
  ulong in_RCX;
  run_entry *in_RDI;
  vector<setup::file_entry,_std::allocator<setup::file_entry>_> *in_R8;
  run_entry entry;
  size_t i_1;
  size_t i;
  flags<setup::info::entry_types_Enum_,_21UL> *in_stack_fffffffffffffdb8;
  size_type in_stack_fffffffffffffdc8;
  vector<setup::run_entry,_std::allocator<setup::run_entry>_> *in_stack_fffffffffffffdd0;
  run_entry *in_stack_fffffffffffffdf0;
  info *in_stack_fffffffffffffed0;
  istream *in_stack_fffffffffffffed8;
  run_entry *in_stack_fffffffffffffee0;
  undefined8 local_48;
  undefined8 local_40;
  
  std::vector<setup::run_entry,_std::allocator<setup::run_entry>_>::clear
            ((vector<setup::run_entry,_std::allocator<setup::run_entry>_> *)0x17aea1);
  flags<setup::info::entry_types_Enum_,_21UL>::operator&
            (in_stack_fffffffffffffdb8,(enum_type)((ulong)in_RDI >> 0x20));
  p_Var1 = ::flags::operator_cast_to_function_pointer
                     ((flags<setup::directory_entry::flags_Enum_,_5UL> *)0x17aeca);
  if (p_Var1 == (TypesafeBoolean)0x0) {
    for (local_48 = 0; local_48 < in_RCX; local_48 = local_48 + 1) {
      run_entry::run_entry(in_stack_fffffffffffffdf0);
      run_entry::load(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,in_stack_fffffffffffffed0)
      ;
      run_entry::~run_entry(in_RDI);
    }
  }
  else {
    std::vector<setup::run_entry,_std::allocator<setup::run_entry>_>::resize
              (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
    for (local_40 = 0; local_40 < in_RCX; local_40 = local_40 + 1) {
      std::vector<setup::file_entry,_std::allocator<setup::file_entry>_>::operator[](in_R8,local_40)
      ;
      run_entry::load(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,in_stack_fffffffffffffed0)
      ;
    }
  }
  return;
}

Assistant:

void info::load_entries(std::istream & is, entry_types entries, size_t count,
                        std::vector<Entry> & result, entry_types::enum_type entry_type) {
	
	result.clear();
	if(entries & entry_type) {
		result.resize(count);
		for(size_t i = 0; i < count; i++) {
			result[i].load(is, *this);
		}
	} else {
		for(size_t i = 0; i < count; i++) {
			Entry entry;
			entry.load(is, *this);
		}
	}
}